

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont_p.h
# Opt level: O2

bool __thiscall QFontDef::operator<(QFontDef *this,QFontDef *other)

{
  undefined1 *puVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  ulong uVar5;
  ulong uVar6;
  QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
  *pQVar7;
  QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
  *pQVar8;
  compare_eq_result_container<QList<QString>,_QString> cVar9;
  compare_lt_result_container<QList<QString>,_QString> cVar10;
  size_t sVar11;
  _Rb_tree_node_base *p_Var12;
  _Base_ptr p_Var13;
  size_t sVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  _Rb_tree_node_base *p_Var19;
  bool bVar20;
  bool bVar21;
  
  dVar3 = this->pixelSize;
  dVar4 = other->pixelSize;
  if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) {
    bVar20 = dVar4 == dVar3;
    bVar21 = dVar4 < dVar3;
LAB_004234a8:
    bVar20 = !bVar21 && !bVar20;
  }
  else {
    uVar5 = *(ulong *)&this->field_0x60;
    uVar16 = (uint)(uVar5 >> 0x20);
    uVar15 = uVar16 >> 8 & 0x3ff;
    uVar6 = *(ulong *)&other->field_0x60;
    uVar18 = (uint)(uVar6 >> 0x20);
    uVar17 = uVar18 >> 8 & 0x3ff;
    bVar20 = uVar15 < uVar17;
    if (uVar15 == uVar17) {
      uVar15 = (uint)(uVar5 >> 0x1c) & 3;
      uVar17 = (uint)(uVar6 >> 0x1c) & 3;
      bVar20 = uVar15 < uVar17;
      if ((((uVar15 == uVar17) &&
           (uVar15 = (uint)(uVar5 >> 0x10) & 0xfff, uVar17 = (uint)(uVar6 >> 0x10) & 0xfff,
           bVar20 = uVar15 < uVar17, uVar15 == uVar17)) &&
          (uVar16 = uVar16 & 0xff, uVar18 = uVar18 & 0xff, bVar20 = uVar16 < uVar18,
          uVar16 == uVar18)) &&
         (uVar16 = (uint)uVar5 & 0xffff, uVar18 = (uint)uVar6 & 0xffff, bVar20 = uVar16 < uVar18,
         uVar16 == uVar18)) {
        cVar9 = QList<QString>::operator!=(&this->families,&other->families);
        if (cVar9) {
          cVar10 = QList<QString>::operator<(&this->families,&other->families);
          return cVar10;
        }
        bVar20 = ::operator!=(&this->styleName,&other->styleName);
        if (bVar20) {
          bVar20 = ::operator<(&this->styleName,&other->styleName);
          return bVar20;
        }
        uVar16 = (uint)(*(ulong *)&this->field_0x60 >> 0x1e) & 3;
        uVar18 = (uint)(*(ulong *)&other->field_0x60 >> 0x1e) & 3;
        bVar20 = uVar16 < uVar18;
        if (uVar16 == uVar18) {
          uVar16 = (uint)(*(ulong *)&this->field_0x60 >> 0x20);
          uVar15 = uVar16 >> 0x13 & 1;
          uVar18 = (uint)(*(ulong *)&other->field_0x60 >> 0x20);
          uVar17 = uVar18 >> 0x13 & 1;
          bVar20 = uVar15 < uVar17;
          if ((uVar15 == uVar17) &&
             (uVar16 = uVar16 >> 0x12 & 1, uVar18 = uVar18 >> 0x12 & 1, bVar20 = uVar16 < uVar18,
             uVar16 == uVar18)) {
            bVar20 = operator!=<QFont::Tag,_float,_true>
                               (&this->variableAxisValues,&other->variableAxisValues);
            if (bVar20) {
              pQVar7 = (this->variableAxisValues).d.d.ptr;
              if (pQVar7 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                             *)0x0) {
                sVar11 = 0;
              }
              else {
                sVar11 = (pQVar7->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
              }
              pQVar8 = (other->variableAxisValues).d.d.ptr;
              if (pQVar8 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                             *)0x0) {
                sVar14 = 0;
              }
              else {
                sVar14 = (pQVar8->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
              }
              if (sVar11 != sVar14) {
                if (pQVar7 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                               *)0x0) {
                  sVar11 = 0;
                }
                else {
                  sVar11 = (pQVar7->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
                }
                if (pQVar8 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                               *)0x0) {
                  sVar14 = 0;
                }
                else {
                  sVar14 = (pQVar8->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
                }
                return (long)sVar11 < (long)sVar14;
              }
              if (pQVar7 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                             *)0x0) {
                p_Var12 = (_Rb_tree_node_base *)0x0;
              }
              else {
                p_Var12 = *(_Base_ptr *)
                           ((long)&(pQVar7->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
              }
              if (pQVar8 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                             *)0x0) {
                p_Var13 = (_Base_ptr)0x0;
              }
              else {
                p_Var13 = *(_Base_ptr *)
                           ((long)&(pQVar8->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
              }
              p_Var19 = &(pQVar7->m)._M_t._M_impl.super__Rb_tree_header._M_header;
              if (pQVar7 == (QMapData<std::map<QFont::Tag,_float,_std::less<QFont::Tag>,_std::allocator<std::pair<const_QFont::Tag,_float>_>_>_>
                             *)0x0) {
                p_Var19 = (_Rb_tree_node_base *)0x0;
              }
              while (p_Var12 != p_Var19) {
                bVar21 = p_Var12[1]._M_color < p_Var13[1]._M_color;
                bVar20 = p_Var12[1]._M_color == p_Var13[1]._M_color;
                if (!bVar20) goto LAB_004234a8;
                fVar2 = *(float *)&p_Var12[1].field_0x4;
                puVar1 = &p_Var13[1].field_0x4;
                bVar20 = fVar2 == *(float *)puVar1;
                bVar21 = fVar2 < *(float *)puVar1;
                if ((!bVar20) || (NAN(fVar2) || NAN(*(float *)puVar1))) goto LAB_004234a8;
                p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
                p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
              }
            }
            bVar20 = false;
          }
        }
      }
    }
  }
  return bVar20;
}

Assistant:

inline bool operator<(const QFontDef &other) const
    {
        if (pixelSize != other.pixelSize) return pixelSize < other.pixelSize;
        if (weight != other.weight) return weight < other.weight;
        if (style != other.style) return style < other.style;
        if (stretch != other.stretch) return stretch < other.stretch;
        if (styleHint != other.styleHint) return styleHint < other.styleHint;
        if (styleStrategy != other.styleStrategy) return styleStrategy < other.styleStrategy;
        if (families != other.families) return families < other.families;
        if (styleName != other.styleName)
            return styleName < other.styleName;
        if (hintingPreference != other.hintingPreference) return hintingPreference < other.hintingPreference;


        if (ignorePitch != other.ignorePitch) return ignorePitch < other.ignorePitch;
        if (fixedPitch != other.fixedPitch) return fixedPitch < other.fixedPitch;
        if (variableAxisValues != other.variableAxisValues) {
            if (variableAxisValues.size() != other.variableAxisValues.size())
                return variableAxisValues.size() < other.variableAxisValues.size();

            {
                auto it = variableAxisValues.constBegin();
                auto jt = other.variableAxisValues.constBegin();
                for (; it != variableAxisValues.constEnd(); ++it, ++jt) {
                    if (it.key() != jt.key())
                        return jt.key() < it.key();
                    if (it.value() != jt.value())
                        return jt.value() < it.value();
                }
            }
        }

        return false;
    }